

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_test.cc
# Opt level: O0

void re2::NamedCapturesErrorArgs(void)

{
  bool bVar1;
  RegexpStatusCode RVar2;
  StringPiece *pSVar3;
  ostream *poVar4;
  LogMessage local_980;
  StringPiece local_800;
  LogMessage local_7f0;
  LogMessage local_670;
  StringPiece local_4f0;
  LogMessage local_4e0;
  StringPiece local_360;
  LogMessage local_350;
  LogMessage local_1d0;
  StringPiece local_40;
  Regexp *local_30;
  Regexp *re;
  RegexpStatus status;
  
  RegexpStatus::RegexpStatus((RegexpStatus *)&re);
  StringPiece::StringPiece(&local_40,"test(?P<name");
  local_30 = Regexp::Parse(&local_40,LikePerl,(RegexpStatus *)&re);
  if (local_30 != (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d0);
    poVar4 = LogMessage::stream(&local_1d0);
    std::operator<<(poVar4,"Check failed: re == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d0);
  }
  RVar2 = RegexpStatus::code((RegexpStatus *)&re);
  if (RVar2 != kRegexpBadNamedCapture) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d1);
    poVar4 = LogMessage::stream(&local_350);
    std::operator<<(poVar4,"Check failed: (status.code()) == (kRegexpBadNamedCapture)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_350);
  }
  pSVar3 = RegexpStatus::error_arg((RegexpStatus *)&re);
  StringPiece::StringPiece(&local_360,"(?P<name");
  bVar1 = operator==(pSVar3,&local_360);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d2);
    poVar4 = LogMessage::stream(&local_4e0);
    std::operator<<(poVar4,"Check failed: (status.error_arg()) == (\"(?P<name\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4e0);
  }
  StringPiece::StringPiece(&local_4f0,"test(?P<space bar>z)");
  local_30 = Regexp::Parse(&local_4f0,LikePerl,(RegexpStatus *)&re);
  if (local_30 != (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_670,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d5);
    poVar4 = LogMessage::stream(&local_670);
    std::operator<<(poVar4,"Check failed: re == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_670);
  }
  RVar2 = RegexpStatus::code((RegexpStatus *)&re);
  if (RVar2 != kRegexpBadNamedCapture) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d6);
    poVar4 = LogMessage::stream(&local_7f0);
    std::operator<<(poVar4,"Check failed: (status.code()) == (kRegexpBadNamedCapture)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7f0);
  }
  pSVar3 = RegexpStatus::error_arg((RegexpStatus *)&re);
  StringPiece::StringPiece(&local_800,"(?P<space bar>");
  bVar1 = operator==(pSVar3,&local_800);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_980,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d7);
    poVar4 = LogMessage::stream(&local_980);
    std::operator<<(poVar4,"Check failed: (status.error_arg()) == (\"(?P<space bar>\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_980);
  }
  RegexpStatus::~RegexpStatus((RegexpStatus *)&re);
  return;
}

Assistant:

TEST(NamedCaptures, ErrorArgs) {
  RegexpStatus status;
  Regexp* re;

  re = Regexp::Parse("test(?P<name", Regexp::LikePerl, &status);
  EXPECT_TRUE(re == NULL);
  EXPECT_EQ(status.code(), kRegexpBadNamedCapture);
  EXPECT_EQ(status.error_arg(), "(?P<name");

  re = Regexp::Parse("test(?P<space bar>z)", Regexp::LikePerl, &status);
  EXPECT_TRUE(re == NULL);
  EXPECT_EQ(status.code(), kRegexpBadNamedCapture);
  EXPECT_EQ(status.error_arg(), "(?P<space bar>");
}